

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_dictionary.hpp
# Opt level: O0

unique_ptr<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>,_true> __thiscall
duckdb::PrimitiveDictionary<short,_int,_duckdb::ParquetCastOperator>::GetTargetMemoryStream
          (PrimitiveDictionary<short,_int,_duckdb::ParquetCastOperator> *this)

{
  pointer this_00;
  idx_t position_p;
  long in_RSI;
  _Head_base<0UL,_duckdb::MemoryStream_*,_false> in_RDI;
  templated_unique_single_t *result;
  unsigned_long *in_stack_ffffffffffffffc0;
  uchar **in_stack_ffffffffffffffc8;
  
  MemoryStream::GetData((MemoryStream *)(in_RSI + 0x60));
  MemoryStream::GetCapacity((MemoryStream *)(in_RSI + 0x60));
  make_uniq<duckdb::MemoryStream,unsigned_char*,unsigned_long>
            (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  this_00 = unique_ptr<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>,_true>::
            operator->((unique_ptr<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>,_true>
                        *)in_RDI._M_head_impl);
  position_p = MemoryStream::GetPosition((MemoryStream *)(in_RSI + 0x60));
  MemoryStream::SetPosition(this_00,position_p);
  return (unique_ptr<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>_>)
         (_Tuple_impl<0UL,_duckdb::MemoryStream_*,_std::default_delete<duckdb::MemoryStream>_>)
         in_RDI._M_head_impl;
}

Assistant:

unique_ptr<MemoryStream> GetTargetMemoryStream() const {
		auto result = make_uniq<MemoryStream>(target_stream.GetData(), target_stream.GetCapacity());
		result->SetPosition(target_stream.GetPosition());
		return result;
	}